

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

int pybind11::detail::generic_type::getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  bool bVar1;
  type_info *ptVar2;
  buffer_info *pbVar3;
  reference puVar4;
  char *pcVar5;
  reference pvVar6;
  unsigned_long s;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  buffer_info *info;
  type_info *tinfo;
  int flags_local;
  Py_buffer *view_local;
  PyObject *obj_local;
  
  ptVar2 = get_type_info(obj->ob_type);
  if ((((view == (Py_buffer *)0x0) || (obj == (PyObject *)0x0)) || (ptVar2 == (type_info *)0x0)) ||
     (ptVar2->get_buffer == (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0)) {
    if (view != (Py_buffer *)0x0) {
      view->obj = (PyObject *)0x0;
    }
    PyErr_SetString(_PyExc_BufferError,"generic_type::getbuffer(): Internal error");
    obj_local._4_4_ = -1;
  }
  else {
    memset(view,0,0x50);
    pbVar3 = (*ptVar2->get_buffer)(obj,ptVar2->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = pbVar3;
    view->buf = *(void **)pbVar3;
    view->itemsize = *(Py_ssize_t *)(pbVar3 + 8);
    view->len = view->itemsize;
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pbVar3 + 0x40));
    s = (unsigned_long)
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pbVar3 + 0x40));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  *)&s);
      if (!bVar1) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      view->len = *puVar4 * view->len;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    if ((flags & 4U) == 4) {
      pcVar5 = (char *)std::__cxx11::string::c_str();
      view->format = pcVar5;
    }
    if ((flags & 0x18U) == 0x18) {
      view->ndim = (int)*(undefined8 *)(pbVar3 + 0x38);
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pbVar3 + 0x58),0
                         );
      view->strides = (Py_ssize_t *)pvVar6;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pbVar3 + 0x40),0
                         );
      view->shape = (Py_ssize_t *)pvVar6;
    }
    _Py_INCREF(view->obj);
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

static int getbuffer(PyObject *obj, Py_buffer *view, int flags) {
        auto tinfo = detail::get_type_info(Py_TYPE(obj));
        if (view == nullptr || obj == nullptr || !tinfo || !tinfo->get_buffer) {
            if (view)
                view->obj = nullptr;
            PyErr_SetString(PyExc_BufferError, "generic_type::getbuffer(): Internal error");
            return -1;
        }
        memset(view, 0, sizeof(Py_buffer));
        buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
        view->obj = obj;
        view->ndim = 1;
        view->internal = info;
        view->buf = info->ptr;
        view->itemsize = (ssize_t) info->itemsize;
        view->len = view->itemsize;
        for (auto s : info->shape)
            view->len *= s;
        if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
            view->format = const_cast<char *>(info->format.c_str());
        if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
            view->ndim = (int) info->ndim;
            view->strides = (ssize_t *) &info->strides[0];
            view->shape = (ssize_t *) &info->shape[0];
        }
        Py_INCREF(view->obj);
        return 0;
    }